

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.hh
# Opt level: O1

void __thiscall
dtc::text_input_buffer::source_location::source_location
          (source_location *this,text_input_buffer *buf)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  int iVar3;
  _Elt_pointer psVar4;
  
  this->buffer = buf;
  psVar4 = (buf->input_stack).c.
           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar4 == (buf->input_stack).c.
                super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    (this->b).super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->b).super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (psVar4 == (buf->input_stack).c.
                  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar4 = (buf->input_stack).c.
               super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    (this->b).super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->b).super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var1;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
  }
  peVar2 = (this->b).super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = peVar2->cursor;
  }
  this->cursor = iVar3;
  return;
}

Assistant:

source_location(text_input_buffer &buf)
			: buffer(buf),
			  b(buf.input_stack.empty() ? nullptr : buf.input_stack.top()),
			  cursor(b ? b->cursor : 0) {}